

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# copy.c
# Opt level: O0

upb_Map * upb_Map_DeepClone(upb_Map *map,upb_CType key_type,upb_CType value_type,
                           upb_MiniTable *map_entry_table,upb_Arena *arena)

{
  _Bool _Var1;
  upb_CType uVar2;
  upb_MiniTableField *f;
  upb_MiniTable *local_80;
  upb_CType value_field_type;
  upb_MiniTable *value_sub;
  upb_MiniTableField *value_field;
  size_t iter;
  upb_MessageValue val;
  upb_MessageValue key;
  upb_Map *cloned_map;
  upb_Arena *arena_local;
  upb_MiniTable *map_entry_table_local;
  upb_CType value_type_local;
  upb_CType key_type_local;
  upb_Map *map_local;
  
  cloned_map = (upb_Map *)arena;
  arena_local = (upb_Arena *)map_entry_table;
  map_entry_table_local._0_4_ = value_type;
  map_entry_table_local._4_4_ = key_type;
  _value_type_local = map;
  key.str_val.size = (size_t)_upb_Map_New(arena,(long)map->key_size,(long)map->val_size);
  if ((upb_Map *)key.str_val.size != (upb_Map *)0x0) {
    value_field = (upb_MiniTableField *)0xffffffffffffffff;
    do {
      _Var1 = upb_Map_Next(_value_type_local,(upb_MessageValue *)&val.str_val.size,
                           (upb_MessageValue *)&iter,(size_t *)&value_field);
      if (!_Var1) {
        return key._8_8_;
      }
      f = upb_MiniTable_MapValue((upb_MiniTable *)arena_local);
      uVar2 = upb_MiniTableField_CType(f);
      if (uVar2 == kUpb_CType_Message) {
        local_80 = upb_MiniTable_GetSubMessageTable((upb_MiniTable *)arena_local,f);
      }
      else {
        local_80 = (upb_MiniTable *)0x0;
      }
      uVar2 = upb_MiniTableField_CType(f);
      _Var1 = upb_Clone_MessageValue(&iter,uVar2,local_80,(upb_Arena *)cloned_map);
      if (!_Var1) {
        return (upb_Map *)0x0;
      }
      _Var1 = upb_Map_Set((upb_Map *)key.str_val.size,stack0xffffffffffffffb8,_iter,
                          (upb_Arena *)cloned_map);
    } while (_Var1);
  }
  return (upb_Map *)0x0;
}

Assistant:

upb_Map* upb_Map_DeepClone(const upb_Map* map, upb_CType key_type,
                           upb_CType value_type,
                           const upb_MiniTable* map_entry_table,
                           upb_Arena* arena) {
  upb_Map* cloned_map = _upb_Map_New(arena, map->key_size, map->val_size);
  if (cloned_map == NULL) {
    return NULL;
  }
  upb_MessageValue key, val;
  size_t iter = kUpb_Map_Begin;
  while (upb_Map_Next(map, &key, &val, &iter)) {
    const upb_MiniTableField* value_field =
        upb_MiniTable_MapValue(map_entry_table);
    const upb_MiniTable* value_sub =
        upb_MiniTableField_CType(value_field) == kUpb_CType_Message
            ? upb_MiniTable_GetSubMessageTable(map_entry_table, value_field)
            : NULL;
    upb_CType value_field_type = upb_MiniTableField_CType(value_field);
    if (!upb_Clone_MessageValue(&val, value_field_type, value_sub, arena)) {
      return NULL;
    }
    if (!upb_Map_Set(cloned_map, key, val, arena)) {
      return NULL;
    }
  }
  return cloned_map;
}